

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void xmlCleanupEncodingAliases(void)

{
  int local_c;
  int i;
  
  if (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0) {
    for (local_c = 0; local_c < xmlCharEncodingAliasesNb; local_c = local_c + 1) {
      if (xmlCharEncodingAliases[local_c].name != (char *)0x0) {
        (*xmlFree)(xmlCharEncodingAliases[local_c].name);
      }
      if (xmlCharEncodingAliases[local_c].alias != (char *)0x0) {
        (*xmlFree)(xmlCharEncodingAliases[local_c].alias);
      }
    }
    xmlCharEncodingAliasesNb = 0;
    xmlCharEncodingAliasesMax = 0;
    (*xmlFree)(xmlCharEncodingAliases);
    xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)0x0;
  }
  return;
}

Assistant:

void
xmlCleanupEncodingAliases(void) {
    int i;

    if (xmlCharEncodingAliases == NULL)
	return;

    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (xmlCharEncodingAliases[i].name != NULL)
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	if (xmlCharEncodingAliases[i].alias != NULL)
	    xmlFree((char *) xmlCharEncodingAliases[i].alias);
    }
    xmlCharEncodingAliasesNb = 0;
    xmlCharEncodingAliasesMax = 0;
    xmlFree(xmlCharEncodingAliases);
    xmlCharEncodingAliases = NULL;
}